

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::
PlainSelectTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,false,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          Vector *result,SelectionVector *sel,idx_t approved_tuple_count)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  string_t sVar6;
  
  lVar1 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (approved_tuple_count == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)sel->sel_vector[uVar2];
      }
      lVar5 = uVar3 - uVar4;
      if (uVar4 <= uVar3 && lVar5 != 0) {
        do {
          StringParquetValueConversion::PlainSkip<true>(plain_data,this);
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      sVar6 = StringParquetValueConversion::PlainRead<true>(plain_data,this);
      *(long *)(lVar1 + uVar3 * 0x10) = sVar6.value._0_8_;
      *(long *)(lVar1 + 8 + uVar3 * 0x10) = sVar6.value._8_8_;
      uVar4 = uVar3 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar2 != approved_tuple_count);
  }
  lVar1 = num_values - uVar4;
  if (uVar4 <= num_values && lVar1 != 0) {
    do {
      StringParquetValueConversion::PlainSkip<true>(plain_data,this);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void PlainSelectTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                  const uint64_t num_values, Vector &result, const SelectionVector &sel,
	                                  idx_t approved_tuple_count) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		auto &result_mask = FlatVector::Validity(result);
		idx_t current_entry = 0;
		for (idx_t i = 0; i < approved_tuple_count; i++) {
			auto next_entry = sel.get_index(i);
			D_ASSERT(current_entry <= next_entry);
			// perform any skips forward if required
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             next_entry - current_entry, current_entry);
			// read this row
			if (HAS_DEFINES && defines[next_entry] != MaxDefine()) {
				result_mask.SetInvalid(next_entry);
			} else {
				result_ptr[next_entry] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
			}
			current_entry = next_entry + 1;
		}
		if (current_entry < num_values) {
			// skip forward to the end of where we are selecting
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             num_values - current_entry, current_entry);
		}
	}